

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

void anon_unknown.dwarf_329815::seterror(cppcms_capi_exception *c,int code,exception *e)

{
  if (c->code == 0) {
    c->code = code;
    (**(code **)(*(long *)e + 0x10))(e);
    std::__cxx11::string::assign((char *)&c->s_msg);
    c->msg = (c->s_msg)._M_dataplus._M_p;
  }
  return;
}

Assistant:

void seterror(cppcms_capi_exception &c,int code,std::exception const &e) 
	{
		if(c.code)
			return;
		c.code = code;
		try {
			c.s_msg = e.what();
			c.msg = c.s_msg.c_str();
		}
		catch(...) {
			strncpy(c.c_msg,e.what(),sizeof(c.c_msg)-1);
			c.msg = c.c_msg;
		}
	}